

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
* wasm::WATParser::fields<wasm::WATParser::ParseTypeDefsCtx>
            (Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
             *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  string_view name;
  FieldT field_00;
  FieldT field_01;
  FieldT field_02;
  pointer pFVar1;
  bool bVar2;
  PackedType *pPVar3;
  Name *pNVar4;
  Field *pFVar5;
  string_view local_290;
  Err local_280;
  Err *local_260;
  Err *err_2;
  Result<wasm::Field> _val_2;
  Result<wasm::Field> field_2;
  string_view local_1f0;
  Err local_1e0;
  Err *local_1c0;
  Err *err_1;
  Result<wasm::Field> _val_1;
  Result<wasm::Field> field_1;
  allocator<char> local_139;
  string local_138;
  Err local_118;
  Err local_f8;
  Err *local_d8;
  Err *err;
  Result<wasm::Field> _val;
  Result<wasm::Field> field;
  optional<wasm::Name> id;
  undefined1 local_48 [8];
  FieldsT res;
  ParseTypeDefsCtx *ctx_local;
  
  res.second.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)ctx;
  TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeFields
            ((FieldsT *)local_48,&ctx->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>);
  do {
    while( true ) {
      while( true ) {
        bVar2 = Lexer::empty((Lexer *)&(res.second.
                                        super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       packedType);
        if ((bVar2) ||
           (bVar2 = Lexer::peekRParen((Lexer *)&(res.second.
                                                 super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                                ->packedType), bVar2)) {
          Result<std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,std::vector<wasm::Field,std::allocator<wasm::Field>>>>
          ::
          Result<std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,std::vector<wasm::Field,std::allocator<wasm::Field>>>>
                    ((Result<std::pair<std::vector<wasm::Name,std::allocator<wasm::Name>>,std::vector<wasm::Field,std::allocator<wasm::Field>>>>
                      *)__return_storage_ptr__,
                     (pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
                      *)local_48);
          goto LAB_024044a7;
        }
        pPVar3 = &(res.second.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage)->packedType;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged,"field");
        bVar2 = Lexer::takeSExprStart((Lexer *)pPVar3,stack0xffffffffffffff98);
        if (bVar2) break;
        fieldtype<wasm::WATParser::ParseTypeDefsCtx>
                  ((Result<wasm::Field> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Field,_wasm::Err>.
                           super__Move_assign_alias<wasm::Field,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20),
                   (ParseTypeDefsCtx *)
                   res.second.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
        Result<wasm::Field>::Result
                  ((Result<wasm::Field> *)&err_2,
                   (Result<wasm::Field> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Field,_wasm::Err>.
                           super__Move_assign_alias<wasm::Field,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20));
        local_260 = Result<wasm::Field>::getErr((Result<wasm::Field> *)&err_2);
        bVar2 = local_260 != (Err *)0x0;
        if (bVar2) {
          wasm::Err::Err(&local_280,local_260);
          Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
          ::Result(__return_storage_ptr__,&local_280);
          wasm::Err::~Err(&local_280);
        }
        Result<wasm::Field>::~Result((Result<wasm::Field> *)&err_2);
        pFVar1 = res.second.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (!bVar2) {
          wasm::Name::Name((Name *)&local_290);
          pFVar5 = Result<wasm::Field>::operator*
                             ((Result<wasm::Field> *)
                              ((long)&_val_2.val.super__Variant_base<wasm::Field,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Field,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20));
          field_02.type.id = (pFVar5->type).id;
          field_02.packedType = pFVar5->packedType;
          field_02.mutable_ = pFVar5->mutable_;
          TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::appendField
                    ((TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx> *)pFVar1,(FieldsT *)local_48,
                     (Name)local_290,field_02);
        }
        Result<wasm::Field>::~Result
                  ((Result<wasm::Field> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Field,_wasm::Err>.
                           super__Move_assign_alias<wasm::Field,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20));
        if (bVar2 && bVar2) goto LAB_024044a7;
      }
      Lexer::takeID((optional<wasm::Name> *)
                    ((long)&field.val.super__Variant_base<wasm::Field,_wasm::Err>.
                            super__Move_assign_alias<wasm::Field,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20),
                    (Lexer *)&(res.second.
                               super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage)->packedType);
      bVar2 = std::optional::operator_cast_to_bool
                        ((optional *)
                         ((long)&field.val.super__Variant_base<wasm::Field,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Field,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20));
      if (bVar2) break;
      while (bVar2 = Lexer::takeRParen((Lexer *)&(res.second.
                                                  super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 )->packedType), ((bVar2 ^ 0xffU) & 1) != 0) {
        fieldtype<wasm::WATParser::ParseTypeDefsCtx>
                  ((Result<wasm::Field> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Field,_wasm::Err>.
                           super__Move_assign_alias<wasm::Field,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20),
                   (ParseTypeDefsCtx *)
                   res.second.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
        Result<wasm::Field>::Result
                  ((Result<wasm::Field> *)&err_1,
                   (Result<wasm::Field> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Field,_wasm::Err>.
                           super__Move_assign_alias<wasm::Field,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20));
        local_1c0 = Result<wasm::Field>::getErr((Result<wasm::Field> *)&err_1);
        bVar2 = local_1c0 != (Err *)0x0;
        if (bVar2) {
          wasm::Err::Err(&local_1e0,local_1c0);
          Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
          ::Result(__return_storage_ptr__,&local_1e0);
          wasm::Err::~Err(&local_1e0);
        }
        Result<wasm::Field>::~Result((Result<wasm::Field> *)&err_1);
        pFVar1 = res.second.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (!bVar2) {
          wasm::Name::Name((Name *)&local_1f0);
          pFVar5 = Result<wasm::Field>::operator*
                             ((Result<wasm::Field> *)
                              ((long)&_val_1.val.super__Variant_base<wasm::Field,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Field,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20));
          field_01.type.id = (pFVar5->type).id;
          field_01.packedType = pFVar5->packedType;
          field_01.mutable_ = pFVar5->mutable_;
          TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::appendField
                    ((TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx> *)pFVar1,(FieldsT *)local_48,
                     (Name)local_1f0,field_01);
        }
        Result<wasm::Field>::~Result
                  ((Result<wasm::Field> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Field,_wasm::Err>.
                           super__Move_assign_alias<wasm::Field,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20));
        if (bVar2 && bVar2) goto LAB_024044a7;
      }
    }
    fieldtype<wasm::WATParser::ParseTypeDefsCtx>
              ((Result<wasm::Field> *)
               ((long)&_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                       super__Move_assign_alias<wasm::Field,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20),
               (ParseTypeDefsCtx *)
               res.second.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    Result<wasm::Field>::Result
              ((Result<wasm::Field> *)&err,
               (Result<wasm::Field> *)
               ((long)&_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                       super__Move_assign_alias<wasm::Field,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20));
    local_d8 = Result<wasm::Field>::getErr((Result<wasm::Field> *)&err);
    bVar2 = local_d8 != (Err *)0x0;
    if (bVar2) {
      wasm::Err::Err(&local_f8,local_d8);
      Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
      ::Result(__return_storage_ptr__,&local_f8);
      wasm::Err::~Err(&local_f8);
    }
    Result<wasm::Field>::~Result((Result<wasm::Field> *)&err);
    if (!bVar2) {
      bVar2 = Lexer::takeRParen((Lexer *)&(res.second.
                                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          packedType);
      pFVar1 = res.second.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (bVar2) {
        pNVar4 = std::optional<wasm::Name>::operator*
                           ((optional<wasm::Name> *)
                            ((long)&field.val.super__Variant_base<wasm::Field,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Field,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20));
        name = (pNVar4->super_IString).str;
        pFVar5 = Result<wasm::Field>::operator*
                           ((Result<wasm::Field> *)
                            ((long)&_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Field,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20));
        field_00.type.id = (pFVar5->type).id;
        field_00.packedType = pFVar5->packedType;
        field_00.mutable_ = pFVar5->mutable_;
        TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::appendField
                  ((TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx> *)pFVar1,(FieldsT *)local_48,
                   (Name)name,field_00);
        bVar2 = false;
      }
      else {
        pPVar3 = &(res.second.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage)->packedType;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"expected end of field",&local_139);
        Lexer::err(&local_118,(Lexer *)pPVar3,&local_138);
        Result<std::pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>_>
        ::Result(__return_storage_ptr__,&local_118);
        wasm::Err::~Err(&local_118);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator(&local_139);
        bVar2 = true;
      }
    }
    Result<wasm::Field>::~Result
              ((Result<wasm::Field> *)
               ((long)&_val.val.super__Variant_base<wasm::Field,_wasm::Err>.
                       super__Move_assign_alias<wasm::Field,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Field,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Field,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Field,_wasm::Err> + 0x20));
  } while (!bVar2);
LAB_024044a7:
  std::
  pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
  ::~pair((pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_std::vector<wasm::Field,_std::allocator<wasm::Field>_>_>
           *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::FieldsT> fields(Ctx& ctx) {
  auto res = ctx.makeFields();
  while (true) {
    if (ctx.in.empty() || ctx.in.peekRParen()) {
      return res;
    }
    if (ctx.in.takeSExprStart("field")) {
      if (auto id = ctx.in.takeID()) {
        auto field = fieldtype(ctx);
        CHECK_ERR(field);
        if (!ctx.in.takeRParen()) {
          return ctx.in.err("expected end of field");
        }
        ctx.appendField(res, *id, *field);
      } else {
        while (!ctx.in.takeRParen()) {
          auto field = fieldtype(ctx);
          CHECK_ERR(field);
          ctx.appendField(res, {}, *field);
        }
      }
    } else {
      auto field = fieldtype(ctx);
      CHECK_ERR(field);
      ctx.appendField(res, {}, *field);
    }
  }
}